

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O3

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint local_a8 [4];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88 [4];
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  ulong local_60;
  
  iVar3 = *(int *)in;
  iVar4 = *(int *)(in + 4);
  iVar5 = *(int *)(in + 8);
  iVar6 = *(int *)(in + 0xc);
  iVar7 = *(int *)(in + 0x10);
  iVar8 = *(int *)(in + 0x14);
  iVar9 = *(int *)(in + 0x18);
  iVar10 = *(int *)(in + 0x1c);
  iVar11 = *(int *)(in + 0x20);
  iVar12 = *(int *)(in + 0x24);
  uVar23 = *(uint *)(in + 0x28);
  local_60 = (ulong)uVar23;
  iVar13 = *(int *)(in + 0x2c);
  iVar14 = *(int *)(in + 0x30);
  iVar15 = *(int *)(in + 0x34);
  iVar16 = *(int *)(in + 0x38);
  iVar17 = *(int *)(in + 0x3c);
  local_98 = (uint)*(undefined8 *)(S->h + 4);
  local_a8[0] = (uint)*(undefined8 *)S->h;
  uVar20 = local_a8[0] + local_98 + iVar3;
  uVar21 = uVar20 ^ S->t[0] ^ 0x510e527f;
  uVar22 = uVar21 << 0x10 | uVar21 >> 0x10;
  local_98 = uVar22 + 0x6a09e667 ^ local_98;
  uVar27 = local_98 << 0x14 | local_98 >> 0xc;
  uStack_94 = (uint)((ulong)*(undefined8 *)(S->h + 4) >> 0x20);
  local_a8[1] = (uint)((ulong)*(undefined8 *)S->h >> 0x20);
  uVar21 = local_a8[1] + uStack_94 + iVar5;
  uVar18 = uVar21 ^ S->t[1] ^ 0x9b05688c;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uStack_94 = uVar18 + 0xbb67ae85 ^ uStack_94;
  uVar24 = iVar4 + uVar20 + uVar27;
  uVar20 = uVar24 ^ uVar22;
  uVar32 = uVar20 << 0x18 | uVar20 >> 8;
  local_88[0] = uVar22 + uVar32 + 0x6a09e667;
  uVar27 = uVar27 ^ local_88[0];
  uVar28 = uVar27 << 0x19 | uVar27 >> 7;
  uVar30 = uStack_94 << 0x14 | uStack_94 >> 0xc;
  uStack_90 = (uint)*(undefined8 *)(S->h + 6);
  local_a8[2] = (uint)*(undefined8 *)(S->h + 2);
  uVar20 = local_a8[2] + uStack_90 + iVar7;
  uVar22 = uVar20 ^ S->f[0] ^ 0x1f83d9ab;
  uVar25 = uVar22 << 0x10 | uVar22 >> 0x10;
  uStack_90 = uVar25 + 0x3c6ef372 ^ uStack_90;
  uVar27 = iVar6 + uVar21 + uVar30;
  uVar21 = uVar27 ^ uVar18;
  uVar29 = uVar21 << 0x18 | uVar21 >> 8;
  local_88[1] = uVar18 + uVar29 + 0xbb67ae85;
  uVar30 = uVar30 ^ local_88[1];
  uVar31 = uVar30 << 0x19 | uVar30 >> 7;
  uVar30 = uStack_90 << 0x14 | uStack_90 >> 0xc;
  uStack_8c = (uint)((ulong)*(undefined8 *)(S->h + 6) >> 0x20);
  local_a8[3] = (uint)((ulong)*(undefined8 *)(S->h + 2) >> 0x20);
  uVar21 = local_a8[3] + uStack_8c + iVar9;
  uVar18 = uVar21 ^ S->f[1] ^ 0x5be0cd19;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uStack_8c = uVar18 + 0xa54ff53a ^ uStack_8c;
  uVar22 = iVar8 + uVar20 + uVar30;
  uVar20 = uVar22 ^ uVar25;
  uVar33 = uVar20 << 0x18 | uVar20 >> 8;
  local_88[2] = uVar33 + uVar25 + 0x3c6ef372;
  uVar30 = uVar30 ^ local_88[2];
  uVar25 = uVar30 << 0x19 | uVar30 >> 7;
  uVar20 = uStack_8c << 0x14 | uStack_8c >> 0xc;
  uVar26 = iVar10 + uVar21 + uVar20;
  uVar21 = uVar26 ^ uVar18;
  uVar30 = uVar21 << 0x18 | uVar21 >> 8;
  local_88[3] = uVar18 + uVar30 + 0xa54ff53a;
  uVar20 = uVar20 ^ local_88[3];
  uVar21 = uVar20 << 0x19 | uVar20 >> 7;
  uVar18 = uVar24 + iVar11 + uVar31;
  uVar30 = uVar30 ^ uVar18;
  uVar20 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_88[2] = local_88[2] + uVar20;
  uVar31 = uVar31 ^ local_88[2];
  uVar24 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar18 = uVar18 + iVar12 + uVar24;
  uVar20 = uVar20 ^ uVar18;
  uVar30 = uVar20 << 0x18 | uVar20 >> 8;
  local_88[2] = local_88[2] + uVar30;
  uVar24 = uVar24 ^ local_88[2];
  uVar31 = uVar24 << 0x19 | uVar24 >> 7;
  uVar20 = uVar27 + uVar23 + uVar25;
  uVar32 = uVar32 ^ uVar20;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[3] = local_88[3] + uVar32;
  uVar25 = uVar25 ^ local_88[3];
  uVar27 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar24 = uVar20 + iVar13 + uVar27;
  uVar32 = uVar32 ^ uVar24;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[3] = local_88[3] + uVar32;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar20 = uVar22 + iVar14 + uVar21;
  uVar29 = uVar29 ^ uVar20;
  uVar22 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_88[0] = local_88[0] + uVar22;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar20 = uVar20 + iVar15 + uVar21;
  uVar22 = uVar22 ^ uVar20;
  uVar29 = uVar22 << 0x18 | uVar22 >> 8;
  local_88[0] = local_88[0] + uVar29;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar22 = uVar26 + iVar16 + uVar28;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[1] = local_88[1] + uVar33;
  uVar28 = uVar28 ^ local_88[1];
  uVar26 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar25 = uVar22 + iVar17 + uVar26;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 << 0x18 | uVar33 >> 8;
  local_88[1] = local_88[1] + uVar33;
  uVar26 = uVar26 ^ local_88[1];
  uVar22 = uVar26 << 0x19 | uVar26 >> 7;
  uVar18 = uVar18 + iVar16 + uVar22;
  uVar32 = uVar32 ^ uVar18;
  uVar26 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar22 = uVar22 ^ local_88[0];
  uVar22 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar18 = uVar18 + uVar23 + uVar22;
  uVar26 = uVar26 ^ uVar18;
  uVar32 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar32;
  uVar22 = uVar22 ^ local_88[0];
  uVar26 = uVar22 << 0x19 | uVar22 >> 7;
  uVar22 = uVar24 + iVar7 + uVar31;
  uVar29 = uVar29 ^ uVar22;
  uVar24 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_88[1] = local_88[1] + uVar24;
  uVar31 = uVar31 ^ local_88[1];
  uVar29 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar22 = uVar22 + iVar11 + uVar29;
  uVar24 = uVar24 ^ uVar22;
  uVar28 = uVar24 << 0x18 | uVar24 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar20 = uVar20 + iVar12 + uVar27;
  uVar33 = uVar33 ^ uVar20;
  uVar31 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[2] = local_88[2] + uVar31;
  uVar27 = uVar27 ^ local_88[2];
  uVar24 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar20 = uVar20 + iVar17 + uVar24;
  uVar31 = uVar31 ^ uVar20;
  uVar33 = uVar31 << 0x18 | uVar31 >> 8;
  local_88[2] = local_88[2] + uVar33;
  uVar24 = uVar24 ^ local_88[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar25 = uVar25 + iVar15 + uVar21;
  uVar30 = uVar30 ^ uVar25;
  uVar27 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar25 = uVar25 + iVar9 + uVar21;
  uVar27 = uVar27 ^ uVar25;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar18 = uVar18 + iVar4 + uVar29;
  uVar27 = uVar27 ^ uVar18;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[2] = local_88[2] + uVar27;
  uVar29 = uVar29 ^ local_88[2];
  uVar30 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar18 = uVar18 + iVar14 + uVar30;
  uVar27 = uVar27 ^ uVar18;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[2] = local_88[2] + uVar27;
  uVar30 = uVar30 ^ local_88[2];
  uVar29 = uVar30 << 0x19 | uVar30 >> 7;
  uVar22 = uVar22 + iVar3 + uVar24;
  uVar32 = uVar32 ^ uVar22;
  uVar30 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[3] = local_88[3] + uVar30;
  uVar24 = uVar24 ^ local_88[3];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar22 = uVar22 + iVar5 + uVar24;
  uVar30 = uVar30 ^ uVar22;
  uVar31 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar24 = uVar24 ^ local_88[3];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar20 = uVar20 + iVar13 + uVar21;
  uVar28 = uVar28 ^ uVar20;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar30;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar20 = uVar20 + iVar10 + uVar21;
  uVar30 = uVar30 ^ uVar20;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar25 = uVar25 + iVar8 + uVar26;
  uVar33 = uVar33 ^ uVar25;
  uVar32 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar30 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar25 = uVar25 + iVar6 + uVar30;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[1] = local_88[1] + uVar32;
  uVar30 = uVar30 ^ local_88[1];
  uVar30 = uVar30 << 0x19 | uVar30 >> 7;
  uVar18 = uVar18 + iVar13 + uVar30;
  uVar31 = uVar31 ^ uVar18;
  uVar26 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar30 = uVar30 ^ local_88[0];
  uVar30 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar18 = uVar18 + iVar11 + uVar30;
  uVar26 = uVar26 ^ uVar18;
  uVar31 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar31;
  uVar30 = uVar30 ^ local_88[0];
  uVar30 = uVar30 << 0x19 | uVar30 >> 7;
  uVar22 = uVar22 + iVar14 + uVar29;
  uVar28 = uVar28 ^ uVar22;
  uVar26 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar26;
  uVar29 = uVar29 ^ local_88[1];
  uVar28 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar22 = uVar22 + iVar3 + uVar28;
  uVar26 = uVar26 ^ uVar22;
  uVar26 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[1] = local_88[1] + uVar26;
  uVar28 = uVar28 ^ local_88[1];
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar20 = uVar20 + iVar8 + uVar24;
  uVar32 = uVar32 ^ uVar20;
  uVar29 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[2] = local_88[2] + uVar29;
  uVar24 = uVar24 ^ local_88[2];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar20 = uVar20 + iVar5 + uVar24;
  uVar29 = uVar29 ^ uVar20;
  uVar32 = uVar29 << 0x18 | uVar29 >> 8;
  local_88[2] = local_88[2] + uVar32;
  uVar24 = uVar24 ^ local_88[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar25 = uVar25 + iVar17 + uVar21;
  uVar27 = uVar27 ^ uVar25;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar25 = uVar25 + iVar15 + uVar21;
  uVar27 = uVar27 ^ uVar25;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar18 = uVar18 + uVar23 + uVar28;
  uVar27 = uVar27 ^ uVar18;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[2] = local_88[2] + uVar27;
  uVar28 = uVar28 ^ local_88[2];
  uVar28 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar18 = uVar18 + iVar16 + uVar28;
  uVar27 = uVar27 ^ uVar18;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[2] = local_88[2] + uVar27;
  uVar28 = uVar28 ^ local_88[2];
  uVar29 = uVar28 << 0x19 | uVar28 >> 7;
  uVar22 = uVar22 + iVar6 + uVar24;
  uVar31 = uVar31 ^ uVar22;
  uVar28 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[3] = local_88[3] + uVar28;
  uVar24 = uVar24 ^ local_88[3];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar22 = uVar22 + iVar9 + uVar24;
  uVar28 = uVar28 ^ uVar22;
  uVar31 = uVar28 << 0x18 | uVar28 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar24 = uVar24 ^ local_88[3];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar20 = uVar20 + iVar10 + uVar21;
  uVar26 = uVar26 ^ uVar20;
  uVar26 = uVar26 << 0x10 | uVar26 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar20 = uVar20 + iVar4 + uVar21;
  uVar26 = uVar26 ^ uVar20;
  uVar28 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar25 = uVar25 + iVar12 + uVar30;
  uVar32 = uVar32 ^ uVar25;
  uVar26 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[1] = local_88[1] + uVar26;
  uVar30 = uVar30 ^ local_88[1];
  uVar30 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar25 = uVar25 + iVar7 + uVar30;
  uVar26 = uVar26 ^ uVar25;
  uVar32 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[1] = local_88[1] + uVar32;
  uVar30 = uVar30 ^ local_88[1];
  uVar30 = uVar30 << 0x19 | uVar30 >> 7;
  uVar18 = uVar18 + iVar10 + uVar30;
  uVar31 = uVar31 ^ uVar18;
  uVar26 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar30 = uVar30 ^ local_88[0];
  uVar30 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar18 = uVar18 + iVar12 + uVar30;
  uVar26 = uVar26 ^ uVar18;
  uVar31 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar31;
  uVar30 = uVar30 ^ local_88[0];
  uVar26 = uVar30 << 0x19 | uVar30 >> 7;
  uVar22 = uVar22 + iVar6 + uVar29;
  uVar28 = uVar28 ^ uVar22;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar30;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar22 = uVar22 + iVar4 + uVar29;
  uVar30 = uVar30 ^ uVar22;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar20 = uVar20 + iVar15 + uVar24;
  uVar32 = uVar32 ^ uVar20;
  uVar30 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[2] = local_88[2] + uVar30;
  uVar24 = uVar24 ^ local_88[2];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar20 = uVar20 + iVar14 + uVar24;
  uVar30 = uVar30 ^ uVar20;
  uVar32 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[2] = local_88[2] + uVar32;
  uVar24 = uVar24 ^ local_88[2];
  uVar24 = uVar24 << 0x19 | uVar24 >> 7;
  uVar25 = uVar25 + iVar13 + uVar21;
  uVar27 = uVar27 ^ uVar25;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar30 = uVar25 + iVar16 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[3] = local_88[3] + uVar27;
  uVar21 = uVar21 ^ local_88[3];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar18 = uVar18 + iVar5 + uVar29;
  uVar27 = uVar27 ^ uVar18;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[2] = local_88[2] + uVar27;
  uVar29 = uVar29 ^ local_88[2];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar18 = uVar18 + iVar9 + uVar29;
  uVar27 = uVar27 ^ uVar18;
  uVar25 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[2] = local_88[2] + uVar25;
  uVar29 = uVar29 ^ local_88[2];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar22 = uVar22 + iVar8 + uVar24;
  uVar31 = uVar31 ^ uVar22;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[3] = local_88[3] + uVar31;
  uVar24 = uVar24 ^ local_88[3];
  uVar27 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar24 = uVar22 + uVar23 + uVar27;
  uVar31 = uVar31 ^ uVar24;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar20 = uVar20 + iVar7 + uVar21;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar28;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar22 = uVar20 + iVar3 + uVar21;
  uVar28 = uVar28 ^ uVar22;
  uVar28 = uVar28 << 0x18 | uVar28 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar21 = uVar21 ^ local_88[0];
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar20 = uVar30 + iVar17 + uVar26;
  uVar32 = uVar32 ^ uVar20;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar26 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar30 = uVar20 + iVar11 + uVar26;
  uVar32 = uVar32 ^ uVar30;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar20 = uVar26 << 0x19 | uVar26 >> 7;
  uVar18 = uVar18 + iVar12 + uVar20;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar31;
  uVar20 = uVar20 ^ local_88[0];
  uVar26 = uVar20 << 0x14 | uVar20 >> 0xc;
  uVar20 = uVar18 + iVar3 + uVar26;
  uVar31 = uVar31 ^ uVar20;
  uVar31 = uVar31 << 0x18 | uVar31 >> 8;
  local_88[0] = local_88[0] + uVar31;
  uVar26 = uVar26 ^ local_88[0];
  uVar26 = uVar26 << 0x19 | uVar26 >> 7;
  uVar18 = uVar24 + iVar8 + uVar29;
  uVar28 = uVar28 ^ uVar18;
  uVar28 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar24 = uVar18 + iVar10 + uVar29;
  uVar28 = uVar28 ^ uVar24;
  uVar28 = uVar28 << 0x18 | uVar28 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar18 = uVar22 + iVar5 + uVar27;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[2] = local_88[2] + uVar32;
  uVar27 = uVar27 ^ local_88[2];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar22 = uVar18 + iVar7 + uVar27;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[2] = local_88[2] + uVar32;
  uVar27 = uVar27 ^ local_88[2];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar30 = uVar30 + uVar23 + uVar21;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[3] = local_88[3] + uVar25;
  uVar21 = uVar21 ^ local_88[3];
  uVar18 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar21 = uVar30 + iVar17 + uVar18;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[3] = local_88[3] + uVar25;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar20 = uVar20 + iVar16 + uVar29;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[2] = local_88[2] + uVar25;
  uVar29 = uVar29 ^ local_88[2];
  uVar30 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar20 = uVar20 + iVar4 + uVar30;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[2] = local_88[2] + uVar25;
  uVar30 = uVar30 ^ local_88[2];
  uVar29 = uVar30 << 0x19 | uVar30 >> 7;
  uVar24 = uVar24 + iVar13 + uVar27;
  uVar31 = uVar31 ^ uVar24;
  uVar30 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[3] = local_88[3] + uVar30;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar24 = uVar24 + iVar14 + uVar27;
  uVar30 = uVar30 ^ uVar24;
  uVar31 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar22 = uVar22 + iVar9 + uVar18;
  uVar28 = uVar28 ^ uVar22;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar30;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar22 = uVar22 + iVar11 + uVar18;
  uVar30 = uVar30 ^ uVar22;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar21 = uVar21 + iVar6 + uVar26;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar30 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar21 = uVar21 + iVar15 + uVar30;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[1] = local_88[1] + uVar32;
  uVar30 = uVar30 ^ local_88[1];
  uVar30 = uVar30 << 0x19 | uVar30 >> 7;
  uVar20 = uVar20 + iVar5 + uVar30;
  uVar31 = uVar31 ^ uVar20;
  uVar26 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar30 = uVar30 ^ local_88[0];
  uVar30 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar20 = uVar20 + iVar14 + uVar30;
  uVar26 = uVar26 ^ uVar20;
  uVar31 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar31;
  uVar30 = uVar30 ^ local_88[0];
  uVar26 = uVar30 << 0x19 | uVar30 >> 7;
  uVar24 = uVar24 + iVar9 + uVar29;
  uVar28 = uVar28 ^ uVar24;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar30;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar24 = uVar24 + uVar23 + uVar29;
  uVar30 = uVar30 ^ uVar24;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar30 = uVar29 << 0x19 | uVar29 >> 7;
  uVar22 = uVar22 + iVar3 + uVar27;
  uVar32 = uVar32 ^ uVar22;
  uVar29 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[2] = local_88[2] + uVar29;
  uVar27 = uVar27 ^ local_88[2];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar22 = uVar22 + iVar13 + uVar27;
  uVar29 = uVar29 ^ uVar22;
  uVar32 = uVar29 << 0x18 | uVar29 >> 8;
  local_88[2] = local_88[2] + uVar32;
  uVar27 = uVar27 ^ local_88[2];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar21 = uVar21 + iVar11 + uVar18;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[3] = local_88[3] + uVar25;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar21 = uVar21 + iVar6 + uVar18;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[3] = local_88[3] + uVar25;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar20 = uVar20 + iVar7 + uVar30;
  uVar25 = uVar25 ^ uVar20;
  uVar25 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[2] = local_88[2] + uVar25;
  uVar30 = uVar30 ^ local_88[2];
  uVar29 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar20 = uVar20 + iVar15 + uVar29;
  uVar25 = uVar25 ^ uVar20;
  uVar30 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[2] = local_88[2] + uVar30;
  uVar29 = uVar29 ^ local_88[2];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar10 + uVar27;
  uVar31 = uVar31 ^ uVar24;
  uVar25 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[3] = local_88[3] + uVar25;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar24 = uVar24 + iVar8 + uVar27;
  uVar25 = uVar25 ^ uVar24;
  uVar31 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar27 = uVar27 ^ local_88[3];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar22 = uVar22 + iVar17 + uVar18;
  uVar28 = uVar28 ^ uVar22;
  uVar25 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar25;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar22 = uVar22 + iVar16 + uVar18;
  uVar25 = uVar25 ^ uVar22;
  uVar28 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar21 = uVar21 + iVar4 + uVar26;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar25 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar21 = uVar21 + iVar12 + uVar25;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[1] = local_88[1] + uVar32;
  uVar25 = uVar25 ^ local_88[1];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar20 = uVar20 + iVar14 + uVar25;
  uVar31 = uVar31 ^ uVar20;
  uVar26 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar25 = uVar25 ^ local_88[0];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar20 = uVar20 + iVar8 + uVar25;
  uVar26 = uVar26 ^ uVar20;
  uVar31 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar31;
  uVar25 = uVar25 ^ local_88[0];
  uVar26 = uVar25 << 0x19 | uVar25 >> 7;
  uVar24 = uVar24 + iVar4 + uVar29;
  uVar28 = uVar28 ^ uVar24;
  uVar25 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar25;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar24 = uVar24 + iVar17 + uVar29;
  uVar25 = uVar25 ^ uVar24;
  uVar28 = uVar25 << 0x18 | uVar25 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar22 = uVar22 + iVar16 + uVar27;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[2] = local_88[2] + uVar32;
  uVar27 = uVar27 ^ local_88[2];
  uVar25 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar22 = uVar22 + iVar15 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[2] = local_88[2] + uVar32;
  uVar21 = uVar21 + iVar7 + uVar18;
  uVar30 = uVar30 ^ uVar21;
  uVar27 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_88[3] = local_88[3] + uVar27;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar21 = uVar21 + uVar23 + uVar18;
  uVar27 = uVar27 ^ uVar21;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  uVar25 = uVar25 ^ local_88[2];
  local_88[3] = local_88[3] + uVar27;
  uVar20 = uVar20 + iVar3 + uVar29;
  uVar27 = uVar27 ^ uVar20;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[2] = local_88[2] + uVar27;
  uVar29 = uVar29 ^ local_88[2];
  uVar30 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar20 = uVar20 + iVar10 + uVar30;
  uVar27 = uVar27 ^ uVar20;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[2] = uVar27 + local_88[2];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar30 = uVar30 ^ local_88[2];
  uVar29 = uVar30 << 0x19 | uVar30 >> 7;
  uVar24 = uVar24 + iVar9 + uVar25;
  uVar31 = uVar31 ^ uVar24;
  uVar30 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[3] = local_88[3] + uVar30;
  uVar25 = uVar25 ^ local_88[3];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar24 = uVar24 + iVar6 + uVar25;
  uVar30 = uVar30 ^ uVar24;
  uVar31 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[3] = local_88[3] + uVar31;
  uVar25 = uVar25 ^ local_88[3];
  uVar25 = uVar25 << 0x19 | uVar25 >> 7;
  uVar22 = uVar22 + iVar12 + uVar18;
  uVar28 = uVar28 ^ uVar22;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar30;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar22 = uVar22 + iVar5 + uVar18;
  uVar30 = uVar30 ^ uVar22;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[0] = local_88[0] + uVar28;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar21 = uVar21 + iVar11 + uVar26;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[1] = local_88[1] + uVar32;
  uVar26 = uVar26 ^ local_88[1];
  uVar30 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar21 = uVar21 + iVar13 + uVar30;
  uVar32 = uVar32 ^ uVar21;
  uVar33 = uVar32 << 0x18 | uVar32 >> 8;
  local_88[1] = local_88[1] + uVar33;
  uVar30 = uVar30 ^ local_88[1];
  uVar30 = uVar30 << 0x19 | uVar30 >> 7;
  uVar20 = uVar20 + iVar15 + uVar30;
  uVar31 = uVar31 ^ uVar20;
  uVar26 = uVar31 << 0x10 | uVar31 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar30 = uVar30 ^ local_88[0];
  uVar30 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar20 = uVar20 + iVar13 + uVar30;
  uVar26 = uVar26 ^ uVar20;
  uVar32 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar32;
  uVar30 = uVar30 ^ local_88[0];
  uVar26 = uVar30 << 0x19 | uVar30 >> 7;
  uVar24 = uVar24 + iVar10 + uVar29;
  uVar28 = uVar28 ^ uVar24;
  uVar30 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[1] = local_88[1] + uVar30;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar24 = uVar24 + iVar16 + uVar29;
  uVar30 = uVar30 ^ uVar24;
  uVar28 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[1] = local_88[1] + uVar28;
  uVar29 = uVar29 ^ local_88[1];
  uVar29 = uVar29 << 0x19 | uVar29 >> 7;
  uVar22 = uVar22 + iVar14 + uVar25;
  uVar33 = uVar33 ^ uVar22;
  uVar30 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[2] = local_88[2] + uVar30;
  uVar25 = uVar25 ^ local_88[2];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar22 = uVar22 + iVar4 + uVar25;
  uVar30 = uVar30 ^ uVar22;
  uVar33 = uVar30 << 0x18 | uVar30 >> 8;
  local_88[2] = local_88[2] + uVar33;
  uVar25 = uVar25 ^ local_88[2];
  uVar30 = uVar25 << 0x19 | uVar25 >> 7;
  uVar21 = uVar21 + iVar6 + uVar18;
  uVar27 = uVar27 ^ uVar21;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[3] = local_88[3] + uVar27;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar21 = uVar21 + iVar12 + uVar18;
  uVar27 = uVar27 ^ uVar21;
  uVar27 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[3] = local_88[3] + uVar27;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar20 = uVar20 + iVar8 + uVar29;
  uVar27 = uVar27 ^ uVar20;
  uVar27 = uVar27 << 0x10 | uVar27 >> 0x10;
  local_88[2] = local_88[2] + uVar27;
  uVar29 = uVar29 ^ local_88[2];
  uVar29 = uVar29 << 0x14 | uVar29 >> 0xc;
  uVar20 = uVar20 + iVar3 + uVar29;
  uVar27 = uVar27 ^ uVar20;
  uVar25 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[2] = uVar25 + local_88[2];
  uVar29 = uVar29 ^ local_88[2];
  uVar31 = uVar29 << 0x19 | uVar29 >> 7;
  uVar24 = uVar24 + iVar17 + uVar30;
  uVar32 = uVar32 ^ uVar24;
  uVar29 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[3] = local_88[3] + uVar29;
  uVar30 = uVar30 ^ local_88[3];
  uVar27 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar24 = uVar24 + iVar7 + uVar27;
  uVar29 = uVar29 ^ uVar24;
  uVar32 = uVar29 << 0x18 | uVar29 >> 8;
  local_88[3] = local_88[3] + uVar32;
  uVar27 = uVar27 ^ local_88[3];
  uVar30 = uVar27 << 0x19 | uVar27 >> 7;
  uVar22 = uVar22 + iVar11 + uVar18;
  uVar28 = uVar28 ^ uVar22;
  uVar27 = uVar28 << 0x10 | uVar28 >> 0x10;
  local_88[0] = local_88[0] + uVar27;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar22 = uVar22 + iVar9 + uVar18;
  uVar27 = uVar27 ^ uVar22;
  uVar29 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[0] = local_88[0] + uVar29;
  uVar18 = uVar18 ^ local_88[0];
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar21 = uVar21 + iVar5 + uVar26;
  uVar33 = uVar33 ^ uVar21;
  uVar28 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[1] = local_88[1] + uVar28;
  uVar26 = uVar26 ^ local_88[1];
  uVar27 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar21 = uVar21 + uVar23 + uVar27;
  uVar28 = uVar28 ^ uVar21;
  uVar33 = uVar28 << 0x18 | uVar28 >> 8;
  local_88[1] = local_88[1] + uVar33;
  uVar27 = uVar27 ^ local_88[1];
  uVar27 = uVar27 << 0x19 | uVar27 >> 7;
  uVar20 = uVar20 + iVar9 + uVar27;
  uVar32 = uVar32 ^ uVar20;
  uVar26 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[0] = local_88[0] + uVar26;
  uVar27 = uVar27 ^ local_88[0];
  uVar27 = uVar27 << 0x14 | uVar27 >> 0xc;
  uVar20 = uVar20 + iVar17 + uVar27;
  uVar26 = uVar26 ^ uVar20;
  uVar32 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[0] = local_88[0] + uVar32;
  uVar27 = uVar27 ^ local_88[0];
  uVar28 = uVar27 << 0x19 | uVar27 >> 7;
  uVar24 = uVar24 + iVar16 + uVar31;
  uVar29 = uVar29 ^ uVar24;
  uVar26 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_88[1] = local_88[1] + uVar26;
  uVar31 = uVar31 ^ local_88[1];
  uVar31 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar27 = uVar24 + iVar12 + uVar31;
  uVar26 = uVar26 ^ uVar27;
  uVar29 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[1] = local_88[1] + uVar29;
  uVar31 = uVar31 ^ local_88[1];
  uVar31 = uVar31 << 0x19 | uVar31 >> 7;
  uVar22 = uVar22 + iVar13 + uVar30;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[2] = local_88[2] + uVar33;
  uVar30 = uVar30 ^ local_88[2];
  uVar26 = uVar30 << 0x14 | uVar30 >> 0xc;
  uVar24 = uVar22 + iVar6 + uVar26;
  uVar33 = uVar33 ^ uVar24;
  uVar33 = uVar33 << 0x18 | uVar33 >> 8;
  local_88[2] = local_88[2] + uVar33;
  uVar26 = uVar26 ^ local_88[2];
  uVar21 = uVar21 + iVar3 + uVar18;
  uVar25 = uVar25 ^ uVar21;
  uVar22 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[3] = local_88[3] + uVar22;
  uVar18 = uVar18 ^ local_88[3];
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar21 = uVar21 + iVar11 + uVar18;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 << 0x18 | uVar22 >> 8;
  local_88[3] = local_88[3] + uVar22;
  uVar20 = uVar20 + iVar14 + uVar31;
  uVar22 = uVar22 ^ uVar20;
  uVar22 = uVar22 << 0x10 | uVar22 >> 0x10;
  local_88[2] = local_88[2] + uVar22;
  uVar31 = uVar31 ^ local_88[2];
  uVar31 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar20 = uVar20 + iVar5 + uVar31;
  uVar22 = uVar22 ^ uVar20;
  uVar30 = uVar22 << 0x18 | uVar22 >> 8;
  local_88[2] = uVar30 + local_88[2];
  uVar25 = uVar26 << 0x19 | uVar26 >> 7;
  uVar21 = uVar21 + uVar28 + uVar23;
  uVar18 = uVar18 ^ local_88[3];
  uVar22 = uVar27 + iVar15 + uVar25;
  uVar32 = uVar32 ^ uVar22;
  uVar26 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[3] = local_88[3] + uVar26;
  uVar25 = uVar25 ^ local_88[3];
  uVar25 = uVar25 << 0x14 | uVar25 >> 0xc;
  uVar27 = uVar22 + iVar10 + uVar25;
  uVar26 = uVar26 ^ uVar27;
  uVar32 = uVar26 << 0x18 | uVar26 >> 8;
  uVar33 = uVar33 ^ uVar21;
  uVar26 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[1] = local_88[1] + uVar26;
  uVar28 = uVar28 ^ local_88[1];
  uVar22 = uVar28 << 0x14 | uVar28 >> 0xc;
  local_88[3] = local_88[3] + uVar32;
  uVar21 = uVar21 + iVar8 + uVar22;
  uVar26 = uVar26 ^ uVar21;
  uVar33 = uVar26 << 0x18 | uVar26 >> 8;
  local_88[1] = local_88[1] + uVar33;
  uVar22 = uVar22 ^ local_88[1];
  uVar28 = uVar22 << 0x19 | uVar22 >> 7;
  uVar22 = uVar20 + uVar23 + uVar28;
  uVar32 = uVar32 ^ uVar22;
  uVar23 = uVar18 << 0x19 | uVar18 >> 7;
  uVar31 = uVar31 ^ local_88[2];
  uVar31 = uVar31 << 0x19 | uVar31 >> 7;
  uVar25 = uVar25 ^ local_88[3];
  uVar26 = uVar25 << 0x19 | uVar25 >> 7;
  uVar18 = uVar24 + iVar4 + uVar23;
  uVar29 = uVar29 ^ uVar18;
  uVar20 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_88[0] = local_88[0] + uVar20;
  uVar23 = uVar23 ^ local_88[0];
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar18 = uVar18 + iVar7 + uVar23;
  uVar20 = uVar20 ^ uVar18;
  uVar25 = uVar20 << 0x18 | uVar20 >> 8;
  local_88[0] = local_88[0] + uVar25;
  uVar23 = uVar23 ^ local_88[0];
  uVar20 = uVar23 << 0x19 | uVar23 >> 7;
  uVar24 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[0] = local_88[0] + uVar24;
  uVar28 = uVar28 ^ local_88[0];
  uVar23 = uVar28 << 0x14 | uVar28 >> 0xc;
  uVar22 = uVar22 + iVar5 + uVar23;
  uVar24 = uVar24 ^ uVar22;
  uVar32 = uVar24 << 0x18 | uVar24 >> 8;
  local_88[0] = local_88[0] + uVar32;
  uVar23 = local_88[0] ^ uVar23;
  uVar23 = uVar23 << 0x19 | uVar23 >> 7;
  uVar24 = uVar27 + iVar11 + uVar31;
  uVar25 = uVar25 ^ uVar24;
  uVar27 = uVar25 << 0x10 | uVar25 >> 0x10;
  local_88[1] = local_88[1] + uVar27;
  uVar31 = uVar31 ^ local_88[1];
  uVar28 = uVar31 << 0x14 | uVar31 >> 0xc;
  uVar25 = uVar24 + iVar7 + uVar28;
  uVar27 = uVar27 ^ uVar25;
  uVar29 = uVar27 << 0x18 | uVar27 >> 8;
  local_88[1] = local_88[1] + uVar29;
  uVar28 = local_88[1] ^ uVar28;
  uVar18 = uVar18 + uVar26 + iVar10;
  uVar33 = uVar33 ^ uVar18;
  uVar24 = uVar33 << 0x10 | uVar33 >> 0x10;
  local_88[2] = local_88[2] + uVar24;
  uVar26 = uVar26 ^ local_88[2];
  uVar26 = uVar26 << 0x14 | uVar26 >> 0xc;
  uVar27 = uVar18 + iVar9 + uVar26;
  uVar24 = uVar24 ^ uVar27;
  uVar18 = uVar24 << 0x18 | uVar24 >> 8;
  local_88[2] = uVar18 + local_88[2];
  uVar21 = uVar21 + iVar4 + uVar20;
  uVar30 = uVar30 ^ uVar21;
  uVar28 = uVar28 << 0x19 | uVar28 >> 7;
  uVar26 = uVar26 ^ local_88[2];
  uVar24 = uVar30 << 0x10 | uVar30 >> 0x10;
  local_88[3] = local_88[3] + uVar24;
  uVar20 = uVar20 ^ local_88[3];
  uVar20 = uVar20 << 0x14 | uVar20 >> 0xc;
  uVar21 = uVar21 + iVar8 + uVar20;
  uVar24 = uVar24 ^ uVar21;
  uVar24 = uVar24 << 0x18 | uVar24 >> 8;
  local_88[3] = local_88[3] + uVar24;
  uVar22 = uVar22 + iVar17 + uVar28;
  uVar24 = uVar24 ^ uVar22;
  uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
  local_88[2] = local_88[2] + uVar24;
  uVar28 = uVar28 ^ local_88[2];
  uVar30 = uVar28 << 0x14 | uVar28 >> 0xc;
  local_a8[0] = uVar22 + iVar13 + uVar30;
  uVar24 = local_a8[0] ^ uVar24;
  local_6c = uVar24 << 0x18 | uVar24 >> 8;
  local_88[2] = local_6c + local_88[2];
  local_88[2] = local_88[2] ^ uVar30;
  uVar24 = uVar26 << 0x19 | uVar26 >> 7;
  uVar22 = uVar25 + iVar12 + uVar24;
  uVar32 = uVar32 ^ uVar22;
  uVar20 = uVar20 ^ local_88[3];
  uVar25 = uVar32 << 0x10 | uVar32 >> 0x10;
  local_88[3] = local_88[3] + uVar25;
  uVar24 = uVar24 ^ local_88[3];
  uVar24 = uVar24 << 0x14 | uVar24 >> 0xc;
  local_a8[1] = uVar22 + iVar16 + uVar24;
  local_a8[1] = local_a8[1] ^ uVar25;
  local_78 = local_a8[1] << 0x18 | local_a8[1] >> 8;
  local_88[3] = local_78 + local_88[3];
  local_88[3] = local_88[3] ^ uVar24;
  uVar20 = uVar20 << 0x19 | uVar20 >> 7;
  uVar22 = uVar27 + iVar6 + uVar20;
  uVar29 = uVar29 ^ uVar22;
  uVar24 = uVar29 << 0x10 | uVar29 >> 0x10;
  local_88[0] = local_88[0] + uVar24;
  uVar20 = uVar20 ^ local_88[0];
  uVar20 = uVar20 << 0x14 | uVar20 >> 0xc;
  local_a8[2] = uVar22 + iVar14 + uVar20;
  uVar24 = local_a8[2] ^ uVar24;
  local_74 = uVar24 << 0x18 | uVar24 >> 8;
  local_88[0] = local_74 + local_88[0];
  local_88[0] = local_88[0] ^ uVar20;
  _uStack_90 = CONCAT44(local_88[0] << 0x19 | local_88[0] >> 7,
                        local_88[3] << 0x19 | local_88[3] >> 7);
  uVar21 = iVar15 + uVar23 + uVar21;
  uVar18 = uVar18 ^ uVar21;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  local_88[1] = local_88[1] + uVar18;
  uVar23 = uVar23 ^ local_88[1];
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  local_a8[3] = uVar21 + iVar3 + uVar23;
  local_a8[3] = local_a8[3] ^ uVar18;
  local_70 = local_a8[3] << 0x18 | local_a8[3] >> 8;
  local_88[1] = local_70 + local_88[1];
  local_88[1] = local_88[1] ^ uVar23;
  _local_98 = CONCAT44(local_88[2] << 0x19 | local_88[2] >> 7,local_88[1] << 0x19 | local_88[1] >> 7
                      );
  lVar19 = 0;
  do {
    puVar1 = S->h + lVar19;
    uVar23 = puVar1[1];
    uVar21 = puVar1[2];
    uVar18 = puVar1[3];
    uVar20 = local_a8[lVar19 + 1];
    uVar22 = local_a8[lVar19 + 2];
    uVar24 = local_a8[lVar19 + 3];
    uVar27 = local_88[lVar19 + 1];
    uVar25 = local_88[lVar19 + 2];
    uVar30 = local_88[lVar19 + 3];
    puVar2 = S->h + lVar19;
    *puVar2 = *puVar1 ^ local_a8[lVar19] ^ local_88[lVar19];
    puVar2[1] = uVar23 ^ uVar20 ^ uVar27;
    puVar2[2] = uVar21 ^ uVar22 ^ uVar25;
    puVar2[3] = uVar18 ^ uVar24 ^ uVar30;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 8);
  return;
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}